

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_workgraph.cpp
# Opt level: O0

Id dxil_spv::emit_dispatch_bit_count(Impl *impl,Id count_minus_1)

{
  Id IVar1;
  Builder *this;
  Operation *this_00;
  Operation *this_01;
  Operation *plus1;
  Operation *bits;
  Id u32_type;
  Builder *builder;
  Id count_minus_1_local;
  Impl *impl_local;
  
  this = Converter::Impl::builder(impl);
  IVar1 = spv::Builder::makeUintType(this,0x20);
  this_00 = Converter::Impl::allocate(impl,OpExtInst,IVar1);
  Operation::add_id(this_00,impl->glsl_std450_ext);
  Operation::add_literal(this_00,0x4b);
  Operation::add_id(this_00,count_minus_1);
  Converter::Impl::add(impl,this_00,false);
  this_01 = Converter::Impl::allocate(impl,OpIAdd,IVar1);
  Operation::add_id(this_01,this_00->id);
  IVar1 = spv::Builder::makeUintConstant(this,1,false);
  Operation::add_id(this_01,IVar1);
  Converter::Impl::add(impl,this_01,false);
  return this_01->id;
}

Assistant:

static spv::Id emit_dispatch_bit_count(Converter::Impl &impl, spv::Id count_minus_1)
{
	auto &builder = impl.builder();
	spv::Id u32_type = builder.makeUintType(32);
	auto *bits = impl.allocate(spv::OpExtInst, u32_type);
	bits->add_id(impl.glsl_std450_ext);
	bits->add_literal(GLSLstd450FindUMsb);
	bits->add_id(count_minus_1);
	impl.add(bits);

	auto *plus1 = impl.allocate(spv::OpIAdd, u32_type);
	plus1->add_id(bits->id);
	plus1->add_id(builder.makeUintConstant(1));
	impl.add(plus1);

	return plus1->id;
}